

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O0

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoLinear>::SolutionT<std::complex<double>>
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoLinear> *this,TPZVec<double> *qsi,int var,
          TPZVec<std::complex<double>_> *sol)

{
  MShapeFunctionType MVar1;
  int iVar2;
  undefined4 extraout_var;
  int64_t iVar3;
  TPZGeoEl *pTVar4;
  ostream *poVar5;
  TPZCompElSide *pTVar6;
  TPZCompEl *pTVar7;
  TPZMaterialDataT<std::complex<double>_> *pTVar8;
  TPZMaterialDataT<std::complex<double>_> *pTVar9;
  long *in_RCX;
  int in_EDX;
  TPZVec<double> *in_RSI;
  TPZFMatrix<double> *in_RDI;
  TPZInterpolationSpace *msp_1;
  int64_t iref_1;
  bool hasPhi;
  MShapeFunctionType shapetype;
  TPZInterpolationSpace *msp;
  int64_t iref;
  TPZGeoEl *ref;
  TPZManVector<TPZMaterialDataT<std::complex<double>_>,_4> datavec;
  int64_t nref;
  TPZManVector<double,_3> myqsi;
  TPZManVector<TPZTransform<double>,_10> trvec;
  TPZMatCombinedSpacesT<std::complex<double>_> *material;
  TPZFNMatrix<9,_double> *in_stack_fffffffffffd4c88;
  TPZMaterialDataT<std::complex<double>_> *in_stack_fffffffffffd4c90;
  TPZCompEl *in_stack_fffffffffffd4c98;
  TPZManVector<TPZMaterialDataT<std::complex<double>_>,_4> *in_stack_fffffffffffd4ca0;
  TPZVec<double> *in_stack_fffffffffffd4cb0;
  TPZVec<double> *in_stack_fffffffffffd4cb8;
  TPZTransform<double> *in_stack_fffffffffffd4cc0;
  TPZVec<double> *in_stack_fffffffffffd4cc8;
  TPZVec<TPZMaterialDataT<std::complex<double>_>_> *this_00;
  TPZManVector<double,_3> *in_stack_fffffffffffd4cd0;
  TPZVec<double> *pTStack_2b2f8;
  int64_t in_stack_fffffffffffd4d28;
  TPZManVector<TPZMaterialDataT<std::complex<double>_>,_4> *in_stack_fffffffffffd4d30;
  long *plStack_2b288;
  REAL *in_stack_fffffffffffd4d90;
  TPZFMatrix<double> *in_stack_fffffffffffd4d98;
  undefined4 in_stack_fffffffffffd4da0;
  undefined4 in_stack_fffffffffffd4da4;
  TPZVec<double> *in_stack_fffffffffffd4da8;
  TPZGeoEl *in_stack_fffffffffffd4db0;
  long lVar10;
  TPZVec<TPZMaterialDataT<std::complex<double>_>_> aTStack_2b238 [5387];
  undefined1 local_10d0 [72];
  TPZVec<TPZTransform<double>_> local_1088 [131];
  long *local_28;
  long *local_20;
  int local_14;
  TPZVec<double> *local_10;
  
  if (in_EDX < 99) {
    local_20 = in_RCX;
    local_14 = in_EDX;
    local_10 = in_RSI;
    iVar2 = (*(in_RDI->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x17])();
    if (CONCAT44(extraout_var,iVar2) == 0) {
      plStack_2b288 = (long *)0x0;
    }
    else {
      plStack_2b288 =
           (long *)__dynamic_cast(CONCAT44(extraout_var,iVar2),&TPZMaterial::typeinfo,
                                  &TPZMatCombinedSpacesT<std::complex<double>>::typeinfo,
                                  0xfffffffffffffffe);
    }
    local_28 = plStack_2b288;
    if (plStack_2b288 == (long *)0x0) {
      (**(code **)(*local_20 + 0x18))(local_20,0);
    }
    else {
      TPZManVector<TPZTransform<double>,_10>::TPZManVector
                ((TPZManVector<TPZTransform<double>,_10> *)in_stack_fffffffffffd4d30,
                 in_stack_fffffffffffd4d28);
      (*(in_RDI->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0x50])(in_RDI,local_1088);
      TPZManVector<double,_3>::TPZManVector(in_stack_fffffffffffd4cd0,in_stack_fffffffffffd4cc8);
      TPZVec<double>::size(local_10);
      TPZVec<double>::resize
                ((TPZVec<double> *)in_stack_fffffffffffd4c90,(int64_t)in_stack_fffffffffffd4c88);
      iVar3 = TPZVec<TPZCompElSide>::size((TPZVec<TPZCompElSide> *)&(in_RDI->fWork).fStore);
      TPZManVector<TPZMaterialDataT<std::complex<double>_>,_4>::TPZManVector
                (in_stack_fffffffffffd4d30,in_stack_fffffffffffd4d28);
      TPZVec<TPZMaterialDataT<std::complex<double>_>_>::resize
                ((TPZVec<TPZMaterialDataT<std::complex<double>_>_> *)in_stack_fffffffffffd4c90,
                 (int64_t)in_stack_fffffffffffd4c88);
      (*(in_RDI->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0x52])(in_RDI,aTStack_2b238,0);
      (**(code **)(*local_28 + 0x50))(local_28,aTStack_2b238);
      pTVar4 = TPZCompEl::Reference(in_stack_fffffffffffd4c98);
      if (pTVar4 == (TPZGeoEl *)0x0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"\nERROR AT ");
        poVar5 = std::operator<<(poVar5,
                                 "void TPZMultiphysicsCompEl<pzgeom::TPZGeoLinear>::SolutionT(TPZVec<REAL> &, int, TPZVec<TVar> &) [TGeometry = pzgeom::TPZGeoLinear, TVar = std::complex<double>]"
                                );
        std::operator<<(poVar5," - this->Reference() == NULL\n");
      }
      else {
        TPZVec<TPZMaterialDataT<std::complex<double>_>_>::operator[](aTStack_2b238,0);
        TPZVec<TPZMaterialDataT<std::complex<double>_>_>::operator[](aTStack_2b238,0);
        TPZVec<TPZMaterialDataT<std::complex<double>_>_>::operator[](aTStack_2b238,0);
        TPZVec<TPZMaterialDataT<std::complex<double>_>_>::operator[](aTStack_2b238,0);
        TPZGeoEl::Jacobian(in_stack_fffffffffffd4db0,in_stack_fffffffffffd4da8,
                           (TPZFMatrix<double> *)
                           CONCAT44(in_stack_fffffffffffd4da4,in_stack_fffffffffffd4da0),
                           in_stack_fffffffffffd4d98,in_stack_fffffffffffd4d90,in_RDI);
        for (lVar10 = 0; lVar10 < iVar3; lVar10 = lVar10 + 1) {
          pTVar6 = TPZVec<TPZCompElSide>::operator[]
                             ((TPZVec<TPZCompElSide> *)&(in_RDI->fWork).fStore,lVar10);
          pTVar7 = TPZCompElSide::Element(pTVar6);
          if (pTVar7 == (TPZCompEl *)0x0) {
            pTStack_2b2f8 = (TPZVec<double> *)0x0;
          }
          else {
            pTStack_2b2f8 =
                 (TPZVec<double> *)
                 __dynamic_cast(pTVar7,&TPZCompEl::typeinfo,&TPZInterpolationSpace::typeinfo,0);
          }
          if (pTStack_2b2f8 != (TPZVec<double> *)0x0) {
            TPZVec<TPZTransform<double>_>::operator[](local_1088,lVar10);
            TPZTransform<double>::Apply
                      (in_stack_fffffffffffd4cc0,in_stack_fffffffffffd4cb8,in_stack_fffffffffffd4cb0
                      );
            iVar2 = (*pTStack_2b2f8->_vptr_TPZVec[0x4d])();
            pTVar8 = TPZVec<TPZMaterialDataT<std::complex<double>_>_>::operator[]
                               (aTStack_2b238,lVar10);
            (pTVar8->super_TPZMaterialData).p = iVar2;
            pTVar8 = TPZVec<TPZMaterialDataT<std::complex<double>_>_>::operator[]
                               (aTStack_2b238,lVar10);
            MVar1 = (pTVar8->super_TPZMaterialData).super_TPZShapeData.fShapeType;
            TPZVec<TPZMaterialDataT<std::complex<double>_>_>::operator[](aTStack_2b238,lVar10);
            if (MVar1 == EVecandShape) {
              pTVar8 = TPZVec<TPZMaterialDataT<std::complex<double>_>_>::operator[]
                                 (aTStack_2b238,lVar10);
              (*pTStack_2b2f8->_vptr_TPZVec[0x56])(pTStack_2b2f8,pTVar8,local_10d0);
            }
            else {
              TPZVec<TPZMaterialDataT<std::complex<double>_>_>::operator[](aTStack_2b238,0);
              TPZVec<TPZMaterialDataT<std::complex<double>_>_>::operator[](aTStack_2b238,lVar10);
              TPZFNMatrix<9,_double>::operator=
                        ((TPZFNMatrix<9,_double> *)in_stack_fffffffffffd4c90,
                         in_stack_fffffffffffd4c88);
              TPZVec<TPZMaterialDataT<std::complex<double>_>_>::operator[](aTStack_2b238,0);
              TPZVec<TPZMaterialDataT<std::complex<double>_>_>::operator[](aTStack_2b238,lVar10);
              TPZFNMatrix<9,_double>::operator=
                        ((TPZFNMatrix<9,_double> *)in_stack_fffffffffffd4c90,
                         in_stack_fffffffffffd4c88);
              in_stack_fffffffffffd4cc0 = (TPZTransform<double> *)0x0;
              this_00 = aTStack_2b238;
              pTVar8 = TPZVec<TPZMaterialDataT<std::complex<double>_>_>::operator[](this_00,0);
              in_stack_fffffffffffd4cb8 = (TPZVec<double> *)(pTVar8->super_TPZMaterialData).detjac;
              pTVar8 = TPZVec<TPZMaterialDataT<std::complex<double>_>_>::operator[](this_00,lVar10);
              (pTVar8->super_TPZMaterialData).detjac = (REAL)in_stack_fffffffffffd4cb8;
              TPZVec<TPZMaterialDataT<std::complex<double>_>_>::operator[]
                        (this_00,(int64_t)in_stack_fffffffffffd4cc0);
              TPZVec<TPZMaterialDataT<std::complex<double>_>_>::operator[](this_00,lVar10);
              in_stack_fffffffffffd4cb0 = pTStack_2b2f8;
              TPZFNMatrix<9,_double>::operator=
                        ((TPZFNMatrix<9,_double> *)in_stack_fffffffffffd4c90,
                         in_stack_fffffffffffd4c88);
              pTVar8 = TPZVec<TPZMaterialDataT<std::complex<double>_>_>::operator[]
                                 (aTStack_2b238,lVar10);
              (*in_stack_fffffffffffd4cb0->_vptr_TPZVec[0x52])
                        (in_stack_fffffffffffd4cb0,local_10d0,pTVar8);
            }
            TPZVec<TPZMaterialDataT<std::complex<double>_>_>::operator[](aTStack_2b238,lVar10);
            TPZInterpolationSpace::ComputeSolution
                      ((TPZInterpolationSpace *)in_stack_fffffffffffd4ca0,
                       (TPZVec<double> *)in_stack_fffffffffffd4c98,in_stack_fffffffffffd4c90,
                       SUB81((ulong)in_stack_fffffffffffd4c88 >> 0x38,0));
            TPZVec<TPZMaterialDataT<std::complex<double>_>_>::operator[](aTStack_2b238,lVar10);
            TPZManVector<double,_3>::Resize
                      ((TPZManVector<double,_3> *)in_stack_fffffffffffd4cc0,
                       (int64_t)in_stack_fffffffffffd4cb8);
            in_stack_fffffffffffd4ca0 =
                 (TPZManVector<TPZMaterialDataT<std::complex<double>_>,_4> *)
                 TPZCompEl::Reference(in_stack_fffffffffffd4c98);
            pTVar8 = TPZVec<TPZMaterialDataT<std::complex<double>_>_>::operator[]
                               (aTStack_2b238,lVar10);
            (*(in_stack_fffffffffffd4ca0->super_TPZVec<TPZMaterialDataT<std::complex<double>_>_>).
              _vptr_TPZVec[0x45])
                      (in_stack_fffffffffffd4ca0,local_10d0,&(pTVar8->super_TPZMaterialData).x);
          }
        }
        (**(code **)(*local_28 + 0x88))(local_28,aTStack_2b238,local_14,local_20);
        for (lVar10 = 0; lVar10 < iVar3; lVar10 = lVar10 + 1) {
          pTVar6 = TPZVec<TPZCompElSide>::operator[]
                             ((TPZVec<TPZCompElSide> *)&(in_RDI->fWork).fStore,lVar10);
          pTVar7 = TPZCompElSide::Element(pTVar6);
          if (pTVar7 == (TPZCompEl *)0x0) {
            in_stack_fffffffffffd4c90 = (TPZMaterialDataT<std::complex<double>_> *)0x0;
          }
          else {
            in_stack_fffffffffffd4c90 =
                 (TPZMaterialDataT<std::complex<double>_> *)
                 __dynamic_cast(pTVar7,&TPZCompEl::typeinfo,&TPZInterpolationSpace::typeinfo,0);
          }
          if (in_stack_fffffffffffd4c90 != (TPZMaterialDataT<std::complex<double>_> *)0x0) {
            pTVar8 = in_stack_fffffffffffd4c90;
            pTVar9 = TPZVec<TPZMaterialDataT<std::complex<double>_>_>::operator[]
                               (aTStack_2b238,lVar10);
            (*(*(_func_int ***)
                &(in_stack_fffffffffffd4c90->super_TPZMaterialData).super_TPZShapeData)[0x54])
                      (in_stack_fffffffffffd4c90,pTVar9);
            in_stack_fffffffffffd4c90 = pTVar8;
          }
        }
      }
      TPZManVector<TPZMaterialDataT<std::complex<double>_>,_4>::~TPZManVector
                (in_stack_fffffffffffd4ca0);
      TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)in_stack_fffffffffffd4c90);
      TPZManVector<TPZTransform<double>,_10>::~TPZManVector
                ((TPZManVector<TPZTransform<double>,_10> *)in_stack_fffffffffffd4ca0);
    }
  }
  else {
    TPZCompEl::Solution((TPZCompEl *)in_stack_fffffffffffd4ca0,
                        (TPZVec<double> *)in_stack_fffffffffffd4c98,
                        (int)((ulong)in_stack_fffffffffffd4c90 >> 0x20),
                        (TPZVec<std::complex<double>_> *)in_stack_fffffffffffd4c88);
  }
  return;
}

Assistant:

void TPZMultiphysicsCompEl<TGeometry>::SolutionT(TPZVec<REAL> &qsi, int var,TPZVec<TVar> &sol)
{
    
    if (var >= 99) {
        TPZCompEl::Solution(qsi, var, sol);
        return;
    }
    
    auto *material =
        dynamic_cast<TPZMatCombinedSpacesT<TVar>*>(this->Material());
    if(!material){
        sol.Resize(0);
        return;
    }
    
    //    TPZManVector<REAL,3> xi(qsi.size());
    //    Reference()->CenterPoint(Reference()->NSides()-1,xi);
    //    for (int i=0; i<xi.size(); i++) {
    //        qsi[i] += 0.001*(xi[i]-qsi[i]);
    //    }
    
    
    TPZManVector<TPZTransform<> > trvec;
    AffineTransform(trvec);
    
    TPZManVector<REAL,3> myqsi(qsi);
    myqsi.resize(qsi.size());
    
    int64_t nref = fElementVec.size();
    TPZManVector<TPZMaterialDataT<TVar>,4> datavec;
    datavec.resize(nref);
    this->InitMaterialData(datavec);
    material->FillDataRequirements(datavec);

    TPZGeoEl * ref = this->Reference();

    
    if (!ref){
        PZError << "\nERROR AT " << __PRETTY_FUNCTION__ << " - this->Reference() == NULL\n";
        return;
    }
    ref->Jacobian(qsi, datavec[0].jacobian, datavec[0].axes,
                  datavec[0].detjac , datavec[0].jacinv);
    for (int64_t iref = 0; iref<nref; iref++)
    {
        
        TPZInterpolationSpace *msp  = dynamic_cast <TPZInterpolationSpace *>(fElementVec[iref].Element());
        if(!msp) continue;
        trvec[iref].Apply(qsi, myqsi);
        datavec[iref].p = msp->MaxOrder();
        
        TPZMaterialData::MShapeFunctionType shapetype = datavec[iref].fShapeType;
        if(shapetype==datavec[iref].EVecandShape){
            msp->ComputeRequiredData(datavec[iref], myqsi);
        }
        else
        {
            datavec[iref].jacobian = datavec[0].jacobian;
            datavec[iref].axes = datavec[0].axes;
            datavec[iref].detjac = datavec[0].detjac;
            datavec[iref].jacinv = datavec[0].jacinv;
            msp->ComputeShape(myqsi,datavec[iref]);
        }
        constexpr bool hasPhi{true};
        msp->ComputeSolution(myqsi, datavec[iref],hasPhi);
        
        datavec[iref].x.Resize(3);
        msp->Reference()->X(myqsi, datavec[iref].x);
    }
    
    material->Solution(datavec, var, sol);
    for (int64_t iref = 0; iref<nref; iref++)
    {
        
        TPZInterpolationSpace *msp  = dynamic_cast <TPZInterpolationSpace *>(fElementVec[iref].Element());
        if(!msp) continue;
        msp->CleanupMaterialData(datavec[iref]);
    }
}